

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkHaigCreateClasses(Vec_Ptr_t *vMembers)

{
  int iVar1;
  Vec_Ptr_t *p;
  undefined8 *puVar2;
  void *pvVar3;
  long *plVar4;
  undefined8 *Entry;
  int local_2c;
  int i;
  Hop_Obj_t *pRepr;
  Hop_Obj_t *pObj;
  Vec_Ptr_t *vClasses;
  Vec_Ptr_t *vMembers_local;
  
  p = Vec_PtrAlloc(0x1002);
  for (local_2c = 0; iVar1 = Vec_PtrSize(vMembers), local_2c < iVar1; local_2c = local_2c + 1) {
    puVar2 = (undefined8 *)Vec_PtrEntry(vMembers,local_2c);
    plVar4 = (long *)*puVar2;
    if (*plVar4 != 0) {
      __assert_fail("pRepr->pData == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcHaig.c"
                    ,0x54,"Vec_Ptr_t *Abc_NtkHaigCreateClasses(Vec_Ptr_t *)");
    }
    if ((*(uint *)(plVar4 + 4) >> 4 & 1) == 0) {
      *(uint *)(plVar4 + 4) = *(uint *)(plVar4 + 4) & 0xffffffef | 0x10;
      Vec_PtrPush(p,plVar4);
    }
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(p), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar3 = Vec_PtrEntry(p,local_2c);
    *(uint *)((long)pvVar3 + 0x20) = *(uint *)((long)pvVar3 + 0x20) & 0xffffffef;
    *(void **)pvVar3 = pvVar3;
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(vMembers), local_2c < iVar1; local_2c = local_2c + 1) {
    puVar2 = (undefined8 *)Vec_PtrEntry(vMembers,local_2c);
    if (*(int *)((long)puVar2 + 0x24) < *(int *)(*(long *)*puVar2 + 0x24)) {
      *(long *)*puVar2 = (long)puVar2;
    }
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(vMembers), local_2c < iVar1; local_2c = local_2c + 1) {
    plVar4 = (long *)Vec_PtrEntry(vMembers,local_2c);
    *plVar4 = *(long *)*plVar4;
    if (*(int *)((long)plVar4 + 0x24) < *(int *)(*plVar4 + 0x24)) {
      __assert_fail("((Hop_Obj_t *)pObj->pData)->Id <= pObj->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcHaig.c"
                    ,0x70,"Vec_Ptr_t *Abc_NtkHaigCreateClasses(Vec_Ptr_t *)");
    }
  }
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p);
    if (iVar1 <= local_2c) {
      for (local_2c = 0; iVar1 = Vec_PtrSize(vMembers), local_2c < iVar1; local_2c = local_2c + 1) {
        puVar2 = (undefined8 *)Vec_PtrEntry(vMembers,local_2c);
        if ((undefined8 *)*puVar2 == puVar2) {
          *puVar2 = 0;
        }
      }
      return p;
    }
    Entry = (undefined8 *)Vec_PtrEntry(p,local_2c);
    puVar2 = (undefined8 *)*Entry;
    if ((undefined8 *)*puVar2 != puVar2) break;
    Vec_PtrWriteEntry(p,local_2c,puVar2);
    Vec_PtrPush(vMembers,Entry);
    local_2c = local_2c + 1;
  }
  __assert_fail("pRepr->pData == pRepr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcHaig.c"
                ,0x77,"Vec_Ptr_t *Abc_NtkHaigCreateClasses(Vec_Ptr_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkHaigCreateClasses( Vec_Ptr_t * vMembers )
{
    Vec_Ptr_t * vClasses;
    Hop_Obj_t * pObj, * pRepr;
    int i;

    // count classes
    vClasses = Vec_PtrAlloc( 4098 );
    Vec_PtrForEachEntry( Hop_Obj_t *, vMembers, pObj, i )
    {
        pRepr = (Hop_Obj_t *)pObj->pData;
        assert( pRepr->pData == NULL );
        if ( pRepr->fMarkA == 0 ) // new
        {
            pRepr->fMarkA = 1;
            Vec_PtrPush( vClasses, pRepr );
        }
    }

    // set representatives as representatives
    Vec_PtrForEachEntry( Hop_Obj_t *, vClasses, pObj, i )
    {
        pObj->fMarkA = 0;
        pObj->pData = pObj;
    }

    // go through the members and update
    Vec_PtrForEachEntry( Hop_Obj_t *, vMembers, pObj, i )
    {
        pRepr = (Hop_Obj_t *)pObj->pData;
        if ( ((Hop_Obj_t *)pRepr->pData)->Id > pObj->Id )
            pRepr->pData = pObj;
    }

    // change representatives of the class
    Vec_PtrForEachEntry( Hop_Obj_t *, vMembers, pObj, i )
    {
        pRepr = (Hop_Obj_t *)pObj->pData;
        pObj->pData = pRepr->pData;
        assert( ((Hop_Obj_t *)pObj->pData)->Id <= pObj->Id );
    }

    // update classes
    Vec_PtrForEachEntry( Hop_Obj_t *, vClasses, pObj, i )
    {
        pRepr = (Hop_Obj_t *)pObj->pData;
        assert( pRepr->pData == pRepr );
//        pRepr->pData = NULL;
        Vec_PtrWriteEntry( vClasses, i, pRepr );
        Vec_PtrPush( vMembers, pObj );
    }

    Vec_PtrForEachEntry( Hop_Obj_t *, vMembers, pObj, i )
        if ( pObj->pData == pObj )
            pObj->pData = NULL;

/*
    Vec_PtrForEachEntry( Hop_Obj_t *, vMembers, pObj, i )
    {
        printf( "ObjId = %4d : ", pObj->Id );
        if ( pObj->pData == NULL )
        {
            printf( "NULL" );
        }
        else
        {
            printf( "%4d", ((Hop_Obj_t *)pObj->pData)->Id );
            assert( ((Hop_Obj_t *)pObj->pData)->Id <= pObj->Id );
        }
        printf( "\n" );
    }
*/
    return vClasses;
}